

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pearson.c
# Opt level: O0

uint8_t pearson_get(uint8_t *data,size_t data_len)

{
  byte local_21;
  size_t sStack_20;
  uint8_t ret;
  size_t data_len_local;
  uint8_t *data_local;
  
  local_21 = (byte)data_len;
  sStack_20 = data_len;
  data_len_local = (size_t)data;
  if (data_len == 0) {
    data_local._7_1_ = 0;
  }
  else {
    do {
      local_21 = permutation_table[(int)(uint)(local_21 ^ *(byte *)data_len_local)];
      sStack_20 = sStack_20 - 1;
      data_len_local = data_len_local + 1;
      data_local._7_1_ = local_21;
    } while (sStack_20 != 0);
  }
  return data_local._7_1_;
}

Assistant:

uint8_t pearson_get(const uint8_t *data, size_t data_len)
{
	uint8_t ret = data_len % 256;

	if (data_len == 0)
		return 0;

	do {
		ret = permutation_table[ret ^ *data++];
	} while (--data_len > 0);

	return ret;
}